

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwt.c
# Opt level: O3

OPJ_BOOL opj_dwt_encode_procedure
                   (opj_thread_pool_t *tp,opj_tcd_tilecomp_t *tilec,
                   opj_encode_and_deinterleave_v_fnptr_type p_encode_and_deinterleave_v,
                   opj_encode_and_deinterleave_h_one_row_fnptr_type
                   p_encode_and_deinterleave_h_one_row)

{
  uint uVar1;
  OPJ_UINT32 OVar2;
  uint uVar3;
  OPJ_INT32 *pOVar4;
  void *ptr;
  undefined8 *user_data;
  void *pvVar5;
  int iVar6;
  uint uVar7;
  opj_tcd_resolution_t *poVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  int iVar13;
  ulong uVar14;
  uint uVar15;
  size_t size;
  OPJ_UINT32 OVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  int iVar20;
  ulong uVar21;
  OPJ_BOOL OVar22;
  bool bVar23;
  
  uVar1 = opj_thread_pool_get_thread_count(tp);
  OVar16 = tilec->numresolutions;
  poVar8 = tilec->resolutions;
  uVar21 = 0;
  iVar13 = OVar16 - 1;
  if (iVar13 != 0) {
    pOVar4 = &poVar8[1].y1;
    uVar7 = 0;
    iVar6 = iVar13;
    do {
      uVar15 = pOVar4[-1] - ((opj_tcd_resolution_t *)(pOVar4 + -3))->x0;
      if (uVar15 < uVar7) {
        uVar15 = uVar7;
      }
      uVar7 = *pOVar4 - pOVar4[-2];
      if ((uint)(*pOVar4 - pOVar4[-2]) < uVar15) {
        uVar7 = uVar15;
      }
      uVar21 = (ulong)uVar7;
      pOVar4 = pOVar4 + 0x30;
      iVar6 = iVar6 + -1;
    } while (iVar6 != 0);
  }
  pOVar4 = tilec->data;
  OVar2 = tilec->x1 - tilec->x0;
  size = uVar21 << 5;
  ptr = opj_aligned_32_malloc(size);
  if (ptr == (void *)0x0 && (int)uVar21 != 0) {
    return 0;
  }
  OVar22 = 1;
  if (iVar13 != 0) {
    poVar8 = poVar8 + iVar13;
    iVar13 = OVar16 - 2;
    do {
      uVar7 = poVar8->x0;
      uVar10 = poVar8->x1 - uVar7;
      uVar15 = poVar8->y1;
      uVar12 = poVar8->y0;
      iVar6 = poVar8[-1].x1 - poVar8[-1].x0;
      uVar18 = uVar15 - uVar12;
      uVar17 = uVar12 & 1;
      if (((int)uVar1 < 2) || (uVar10 < 0x10)) {
        uVar21 = 0;
        if (7 < uVar10) {
          uVar19 = 0;
          do {
            uVar21 = (ulong)(uVar19 + 8);
            (*p_encode_and_deinterleave_v)(pOVar4 + uVar19,ptr,uVar18,uVar17 ^ 1,OVar2,8);
            uVar11 = uVar19 + 0xf;
            uVar19 = uVar19 + 8;
          } while (uVar11 < uVar10);
        }
        OVar16 = uVar10 - (uint)uVar21;
        if ((uint)uVar21 <= uVar10 && OVar16 != 0) {
          (*p_encode_and_deinterleave_v)(pOVar4 + uVar21,ptr,uVar18,uVar17 ^ 1,OVar2,OVar16);
        }
      }
      else {
        iVar9 = poVar8[-1].y1 - poVar8[-1].y0;
        uVar19 = uVar1;
        if (uVar10 < uVar1) {
          uVar19 = uVar10;
        }
        iVar20 = 0;
        uVar11 = uVar10 / uVar19 & 0xfffffff8;
        do {
          user_data = (undefined8 *)opj_malloc(0x38);
          if (user_data == (undefined8 *)0x0) goto LAB_0010a6ee;
          pvVar5 = opj_aligned_32_malloc(size);
          *user_data = pvVar5;
          if (pvVar5 == (void *)0x0) {
            opj_thread_pool_wait_completion(tp,0);
            goto LAB_0010a725;
          }
          *(uint *)(user_data + 1) = uVar18 - iVar9;
          *(int *)((long)user_data + 0xc) = iVar9;
          *(uint *)(user_data + 2) = uVar17;
          *(uint *)(user_data + 3) = uVar18;
          *(OPJ_UINT32 *)((long)user_data + 0x1c) = OVar2;
          user_data[4] = pOVar4;
          *(uint *)(user_data + 5) = iVar20 * uVar11;
          iVar20 = iVar20 + 1;
          uVar3 = iVar20 * uVar11;
          if (uVar19 == 1) {
            uVar3 = uVar10;
          }
          *(uint *)((long)user_data + 0x2c) = uVar3;
          user_data[6] = p_encode_and_deinterleave_v;
          opj_thread_pool_submit_job(tp,opj_dwt_encode_v_func,user_data);
          uVar19 = uVar19 - 1;
        } while (uVar19 != 0);
        opj_thread_pool_wait_completion(tp,0);
      }
      uVar7 = uVar7 & 1;
      if (((int)uVar1 < 2) || (uVar18 < 2)) {
        if (uVar15 != uVar12) {
          uVar21 = (ulong)uVar18;
          uVar14 = 0;
          do {
            (*p_encode_and_deinterleave_h_one_row)(pOVar4 + uVar14,ptr,uVar10,uVar7 ^ 1);
            uVar14 = (ulong)((int)uVar14 + OVar2);
            uVar21 = uVar21 - 1;
          } while (uVar21 != 0);
        }
      }
      else {
        uVar15 = uVar1;
        if (uVar18 < uVar1) {
          uVar15 = uVar18;
        }
        iVar9 = 0;
        uVar12 = uVar18 / uVar15;
        do {
          user_data = (undefined8 *)opj_malloc(0x38);
          if (user_data == (undefined8 *)0x0) goto LAB_0010a6ee;
          pvVar5 = opj_aligned_32_malloc(size);
          *user_data = pvVar5;
          if (pvVar5 == (void *)0x0) {
            opj_thread_pool_wait_completion(tp,0);
LAB_0010a725:
            opj_free(user_data);
            goto LAB_0010a72a;
          }
          *(uint *)(user_data + 1) = uVar10 - iVar6;
          *(int *)((long)user_data + 0xc) = iVar6;
          *(uint *)(user_data + 2) = uVar7;
          *(uint *)(user_data + 3) = uVar10;
          *(OPJ_UINT32 *)((long)user_data + 0x1c) = OVar2;
          user_data[4] = pOVar4;
          *(uint *)(user_data + 5) = iVar9 * uVar12;
          iVar9 = iVar9 + 1;
          uVar17 = iVar9 * uVar12;
          if (uVar15 == 1) {
            uVar17 = uVar18;
          }
          *(uint *)((long)user_data + 0x2c) = uVar17;
          user_data[6] = p_encode_and_deinterleave_h_one_row;
          opj_thread_pool_submit_job(tp,opj_dwt_encode_h_func,user_data);
          uVar15 = uVar15 - 1;
        } while (uVar15 != 0);
        opj_thread_pool_wait_completion(tp,0);
      }
      poVar8 = poVar8 + -1;
      bVar23 = iVar13 != 0;
      iVar13 = iVar13 + -1;
    } while (bVar23);
    OVar22 = 1;
  }
LAB_0010a72f:
  opj_aligned_free(ptr);
  return OVar22;
LAB_0010a6ee:
  opj_thread_pool_wait_completion(tp,0);
LAB_0010a72a:
  OVar22 = 0;
  goto LAB_0010a72f;
}

Assistant:

static INLINE OPJ_BOOL opj_dwt_encode_procedure(opj_thread_pool_t* tp,
        opj_tcd_tilecomp_t * tilec,
        opj_encode_and_deinterleave_v_fnptr_type p_encode_and_deinterleave_v,
        opj_encode_and_deinterleave_h_one_row_fnptr_type
        p_encode_and_deinterleave_h_one_row)
{
    OPJ_INT32 i;
    OPJ_INT32 *bj = 00;
    OPJ_UINT32 w;
    OPJ_INT32 l;

    OPJ_SIZE_T l_data_size;

    opj_tcd_resolution_t * l_cur_res = 0;
    opj_tcd_resolution_t * l_last_res = 0;
    const int num_threads = opj_thread_pool_get_thread_count(tp);
    OPJ_INT32 * OPJ_RESTRICT tiledp = tilec->data;

    w = (OPJ_UINT32)(tilec->x1 - tilec->x0);
    l = (OPJ_INT32)tilec->numresolutions - 1;

    l_cur_res = tilec->resolutions + l;
    l_last_res = l_cur_res - 1;

    l_data_size = opj_dwt_max_resolution(tilec->resolutions, tilec->numresolutions);
    /* overflow check */
    if (l_data_size > (SIZE_MAX / (NB_ELTS_V8 * sizeof(OPJ_INT32)))) {
        /* FIXME event manager error callback */
        return OPJ_FALSE;
    }
    l_data_size *= NB_ELTS_V8 * sizeof(OPJ_INT32);
    bj = (OPJ_INT32*)opj_aligned_32_malloc(l_data_size);
    /* l_data_size is equal to 0 when numresolutions == 1 but bj is not used */
    /* in that case, so do not error out */
    if (l_data_size != 0 && ! bj) {
        return OPJ_FALSE;
    }
    i = l;

    while (i--) {
        OPJ_UINT32 j;
        OPJ_UINT32 rw;           /* width of the resolution level computed   */
        OPJ_UINT32 rh;           /* height of the resolution level computed  */
        OPJ_UINT32
        rw1;      /* width of the resolution level once lower than computed one                                       */
        OPJ_UINT32
        rh1;      /* height of the resolution level once lower than computed one                                      */
        OPJ_INT32 cas_col;  /* 0 = non inversion on horizontal filtering 1 = inversion between low-pass and high-pass filtering */
        OPJ_INT32 cas_row;  /* 0 = non inversion on vertical filtering 1 = inversion between low-pass and high-pass filtering   */
        OPJ_INT32 dn, sn;

        rw  = (OPJ_UINT32)(l_cur_res->x1 - l_cur_res->x0);
        rh  = (OPJ_UINT32)(l_cur_res->y1 - l_cur_res->y0);
        rw1 = (OPJ_UINT32)(l_last_res->x1 - l_last_res->x0);
        rh1 = (OPJ_UINT32)(l_last_res->y1 - l_last_res->y0);

        cas_row = l_cur_res->x0 & 1;
        cas_col = l_cur_res->y0 & 1;

        sn = (OPJ_INT32)rh1;
        dn = (OPJ_INT32)(rh - rh1);

        /* Perform vertical pass */
        if (num_threads <= 1 || rw < 2 * NB_ELTS_V8) {
            for (j = 0; j + NB_ELTS_V8 - 1 < rw; j += NB_ELTS_V8) {
                p_encode_and_deinterleave_v(tiledp + j,
                                            bj,
                                            rh,
                                            cas_col == 0,
                                            w,
                                            NB_ELTS_V8);
            }
            if (j < rw) {
                p_encode_and_deinterleave_v(tiledp + j,
                                            bj,
                                            rh,
                                            cas_col == 0,
                                            w,
                                            rw - j);
            }
        }  else {
            OPJ_UINT32 num_jobs = (OPJ_UINT32)num_threads;
            OPJ_UINT32 step_j;

            if (rw < num_jobs) {
                num_jobs = rw;
            }
            step_j = ((rw / num_jobs) / NB_ELTS_V8) * NB_ELTS_V8;

            for (j = 0; j < num_jobs; j++) {
                opj_dwt_encode_v_job_t* job;

                job = (opj_dwt_encode_v_job_t*) opj_malloc(sizeof(opj_dwt_encode_v_job_t));
                if (!job) {
                    opj_thread_pool_wait_completion(tp, 0);
                    opj_aligned_free(bj);
                    return OPJ_FALSE;
                }
                job->v.mem = (OPJ_INT32*)opj_aligned_32_malloc(l_data_size);
                if (!job->v.mem) {
                    opj_thread_pool_wait_completion(tp, 0);
                    opj_free(job);
                    opj_aligned_free(bj);
                    return OPJ_FALSE;
                }
                job->v.dn = dn;
                job->v.sn = sn;
                job->v.cas = cas_col;
                job->rh = rh;
                job->w = w;
                job->tiledp = tiledp;
                job->min_j = j * step_j;
                job->max_j = (j + 1 == num_jobs) ? rw : (j + 1) * step_j;
                job->p_encode_and_deinterleave_v = p_encode_and_deinterleave_v;
                opj_thread_pool_submit_job(tp, opj_dwt_encode_v_func, job);
            }
            opj_thread_pool_wait_completion(tp, 0);
        }

        sn = (OPJ_INT32)rw1;
        dn = (OPJ_INT32)(rw - rw1);

        /* Perform horizontal pass */
        if (num_threads <= 1 || rh <= 1) {
            for (j = 0; j < rh; j++) {
                OPJ_INT32* OPJ_RESTRICT aj = tiledp + j * w;
                (*p_encode_and_deinterleave_h_one_row)(aj, bj, rw,
                                                       cas_row == 0 ? OPJ_TRUE : OPJ_FALSE);
            }
        }  else {
            OPJ_UINT32 num_jobs = (OPJ_UINT32)num_threads;
            OPJ_UINT32 step_j;

            if (rh < num_jobs) {
                num_jobs = rh;
            }
            step_j = (rh / num_jobs);

            for (j = 0; j < num_jobs; j++) {
                opj_dwt_encode_h_job_t* job;

                job = (opj_dwt_encode_h_job_t*) opj_malloc(sizeof(opj_dwt_encode_h_job_t));
                if (!job) {
                    opj_thread_pool_wait_completion(tp, 0);
                    opj_aligned_free(bj);
                    return OPJ_FALSE;
                }
                job->h.mem = (OPJ_INT32*)opj_aligned_32_malloc(l_data_size);
                if (!job->h.mem) {
                    opj_thread_pool_wait_completion(tp, 0);
                    opj_free(job);
                    opj_aligned_free(bj);
                    return OPJ_FALSE;
                }
                job->h.dn = dn;
                job->h.sn = sn;
                job->h.cas = cas_row;
                job->rw = rw;
                job->w = w;
                job->tiledp = tiledp;
                job->min_j = j * step_j;
                job->max_j = (j + 1U) * step_j; /* this can overflow */
                if (j == (num_jobs - 1U)) {  /* this will take care of the overflow */
                    job->max_j = rh;
                }
                job->p_function = p_encode_and_deinterleave_h_one_row;
                opj_thread_pool_submit_job(tp, opj_dwt_encode_h_func, job);
            }
            opj_thread_pool_wait_completion(tp, 0);
        }

        l_cur_res = l_last_res;

        --l_last_res;
    }

    opj_aligned_free(bj);
    return OPJ_TRUE;
}